

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Consumable.cpp
# Opt level: O2

shared_ptr<Consumable> Consumable::generateConsumable(void)

{
  int iVar1;
  time_t tVar2;
  Consumable *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<Consumable> sVar3;
  string local_68;
  string local_48 [8];
  string hpn;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  iVar1 = rand();
  iVar1 = iVar1 % 100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_48,"Lesser Health Potion",(allocator<char> *)(hpn.field_2._M_local_buf + 0xf));
  if ((0x50 < iVar1) || (0x32 < iVar1)) {
    std::__cxx11::string::assign((char *)local_48);
  }
  this = (Consumable *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_68,local_48);
  Consumable(this,&local_68,(long)iVar1);
  std::__shared_ptr<Consumable,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Consumable,void>
            ((__shared_ptr<Consumable,(__gnu_cxx::_Lock_policy)2> *)in_RDI,this);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  sVar3.super___shared_ptr<Consumable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Consumable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Consumable>)sVar3.super___shared_ptr<Consumable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Consumable> Consumable::generateConsumable() {
    unsigned seed = time(0);
    srand(seed);
    int hp = rand() % 100;
    std::string hpn = "Lesser Health Potion";
    if(hp > 80)
        hpn = "Greater Health Potion";
    else if(hp > 50)
        hpn = "Great Health Potion";

    std::shared_ptr<Consumable> cons(new Consumable(hpn, hp));

    return cons;
}